

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Function * __thiscall wasm::TranslateToFuzzReader::addFunction(TranslateToFuzzReader *this)

{
  Module *pMVar1;
  value_type pEVar2;
  variant<wasm::Name,_wasm::HeapType> value;
  string_view name;
  pointer pFVar3;
  byte bVar4;
  bool bVar5;
  Index IVar6;
  Expression *pEVar7;
  long lVar8;
  Export *this_00;
  size_type sVar9;
  Iterator IVar10;
  Iterator IVar11;
  Name NVar12;
  anon_class_16_2_1f26aaf3 visitor;
  byte local_302;
  RefFunc *local_228;
  reference local_220;
  value_type *randomElem;
  vector<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_> *local_210;
  undefined1 local_208 [8];
  vector<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_> compatibleSegments;
  undefined1 local_1e8 [8];
  Type type_2;
  pointer puStack_1d8;
  pointer local_1d0;
  bool validExportParams;
  Type local_160;
  Type local_158;
  Type bodyType;
  FunctionCreationContext context;
  value_type local_c0;
  Type type_1;
  Index i_1;
  Index numVars;
  Signature local_a0;
  HeapType local_90;
  pointer local_88;
  Type resultType;
  Type paramType;
  Type type;
  undefined1 local_68 [4];
  Index i;
  vector<wasm::Type,_std::allocator<wasm::Type>_> params;
  Index numParams;
  string_view local_40;
  string_view local_30;
  pointer local_20;
  Function *func;
  __single_object allocation;
  TranslateToFuzzReader *this_local;
  
  allocation._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)this;
  IVar6 = upToSquared(this,100);
  this->LOGGING_PERCENT = IVar6;
  std::make_unique<wasm::Function>();
  local_20 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get
                       ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&func);
  pMVar1 = this->wasm;
  Name::Name((Name *)&local_40,"func");
  local_30 = (string_view)Names::getValidFunctionName(pMVar1,(Name)local_40);
  Name::operator=((Name *)local_20,(Name *)&local_30);
  params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage._0_4_ = upToSquared(this,(this->fuzzParams->super_FuzzParams).MAX_PARAMS);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_68);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::reserve
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_68,
             (ulong)(Index)params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
  for (type.id._4_4_ = 0;
      type.id._4_4_ <
      (Index)params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage; type.id._4_4_ = type.id._4_4_ + 1) {
    paramType = getSingleConcreteType(this);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_68,&paramType);
  }
  wasm::Type::Type(&resultType,(vector *)local_68);
  local_88 = (pointer)getControlFlowType(this);
  Signature::Signature(&local_a0,resultType,(Type)local_88);
  wasm::HeapType::HeapType(&local_90,local_a0);
  (local_20->type).id = local_90.id;
  type_1.id._4_4_ = upToSquared(this,(this->fuzzParams->super_FuzzParams).MAX_VARS);
  for (type_1.id._0_4_ = 0; (uint)type_1.id < type_1.id._4_4_; type_1.id._0_4_ = (uint)type_1.id + 1
      ) {
    local_c0.id = (uintptr_t)getConcreteType(this);
    bVar4 = wasm::TypeUpdating::canHandleAsLocal((Type)local_c0.id);
    if ((bVar4 & 1) == 0) {
      Type::Type((Type *)&context.typeLocals._M_h._M_single_bucket,i32);
      local_c0.id = (uintptr_t)context.typeLocals._M_h._M_single_bucket;
    }
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back(&local_20->vars,&local_c0);
  }
  FunctionCreationContext::FunctionCreationContext
            ((FunctionCreationContext *)&bodyType,this,local_20);
  local_158 = Function::getResults(local_20);
  bVar5 = oneIn(this,10);
  if (bVar5) {
    Type::Type(&local_160,unreachable);
    local_158.id = local_160.id;
  }
  bVar5 = oneIn(this,2);
  if (bVar5) {
    pEVar7 = makeBlock(this,local_158);
    local_20->body = pEVar7;
  }
  else {
    pEVar7 = make(this,local_158);
    local_20->body = pEVar7;
  }
  wasm::Module::addFunction((unique_ptr *)this->wasm);
  IVar10 = Type::begin(&resultType);
  IVar11 = Type::end(&resultType);
  bVar5 = std::all_of<wasm::Type::Iterator,wasm::TranslateToFuzzReader::addFunction()::__0>
                    (IVar10.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     parent,IVar10.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            index,
                     IVar11.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     parent,IVar11.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            index);
  if (bVar5) {
    if (this->numAddedFunctions != 0) {
      bVar5 = oneIn(this,2);
      if (!bVar5) goto LAB_001e12b4;
    }
    NVar12.super_IString.str._M_str =
         (char *)(local_20->super_Importable).super_Named.name.super_IString.str._M_len;
    NVar12.super_IString.str._M_len = (size_t)this->wasm;
    lVar8 = wasm::Module::getExportOrNull(NVar12);
    if ((lVar8 == 0) && ((this->preserveImportsAndExports & 1U) == 0)) {
      pMVar1 = this->wasm;
      this_00 = (Export *)operator_new(0x30);
      name = (local_20->super_Importable).super_Named.name.super_IString.str;
      std::variant<wasm::Name,wasm::HeapType>::variant<wasm::Name&,void,void,wasm::Name,void>
                ((variant<wasm::Name,wasm::HeapType> *)&type_2,(Name *)local_20);
      value.super__Variant_base<wasm::Name,_wasm::HeapType>.
      super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
      super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
      super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
      super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
      super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.
      super_IString.str._M_str = (char *)puStack_1d8;
      value.super__Variant_base<wasm::Name,_wasm::HeapType>.
      super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
      super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
      super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
      super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
      super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.
      super_IString.str._M_len = type_2.id;
      value.super__Variant_base<wasm::Name,_wasm::HeapType>.
      super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
      super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
      super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
      super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
      super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._16_8_ = local_1d0;
      Export::Export(this_00,(Name)name,Function,value);
      wasm::Module::addExport((Export *)pMVar1);
    }
  }
LAB_001e12b4:
  while( true ) {
    bVar5 = oneIn(this,3);
    local_302 = 0;
    if (bVar5) {
      bVar5 = Random::finished(&this->random);
      local_302 = bVar5 ^ 0xff;
    }
    pFVar3 = local_20;
    if ((local_302 & 1) == 0) break;
    compatibleSegments.
    super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)(local_20->type).id;
    Type::Type((Type *)local_1e8,
               (HeapType)
               compatibleSegments.
               super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage,NonNullable,Inexact);
    std::vector<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>::vector
              ((vector<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_> *)local_208)
    ;
    randomElem = (value_type *)local_1e8;
    visitor.compatibleSegments =
         (vector<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_> *)randomElem;
    visitor.type = (Type *)local_208;
    local_210 = (vector<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_> *)local_208
    ;
    ModuleUtils::iterActiveElementSegments<wasm::TranslateToFuzzReader::addFunction()::__1>
              ((ModuleUtils *)this->wasm,(Module *)randomElem,visitor);
    sVar9 = std::vector<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>::size
                      ((vector<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_> *)
                       local_208);
    IVar6 = upTo(this,(Index)sVar9);
    local_220 = std::vector<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>::
                operator[]((vector<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                            *)local_208,(ulong)IVar6);
    pEVar2 = *local_220;
    local_228 = Builder::makeRefFunc
                          (&this->builder,
                           (Name)(local_20->super_Importable).super_Named.name.super_IString.str,
                           (HeapType)(local_20->type).id);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (&pEVar2->data,(value_type *)&local_228);
    std::vector<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>::~vector
              ((vector<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_> *)local_208)
    ;
  }
  this->numAddedFunctions = this->numAddedFunctions + 1;
  FunctionCreationContext::~FunctionCreationContext((FunctionCreationContext *)&bodyType);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_68);
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
            ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&func);
  return pFVar3;
}

Assistant:

Function* TranslateToFuzzReader::addFunction() {
  LOGGING_PERCENT = upToSquared(100);
  auto allocation = std::make_unique<Function>();
  auto* func = allocation.get();
  func->name = Names::getValidFunctionName(wasm, "func");
  Index numParams = upToSquared(fuzzParams->MAX_PARAMS);
  std::vector<Type> params;
  params.reserve(numParams);
  for (Index i = 0; i < numParams; i++) {
    auto type = getSingleConcreteType();
    params.push_back(type);
  }
  auto paramType = Type(params);
  auto resultType = getControlFlowType();
  func->type = Signature(paramType, resultType);
  Index numVars = upToSquared(fuzzParams->MAX_VARS);
  for (Index i = 0; i < numVars; i++) {
    auto type = getConcreteType();
    if (!TypeUpdating::canHandleAsLocal(type)) {
      type = Type::i32;
    }
    func->vars.push_back(type);
  }
  // Generate the function creation context after we filled in locals, which it
  // will scan.
  FunctionCreationContext context(*this, func);
  // with small chance, make the body unreachable
  auto bodyType = func->getResults();
  if (oneIn(10)) {
    bodyType = Type::unreachable;
  }
  // with reasonable chance make the body a block
  if (oneIn(2)) {
    func->body = makeBlock(bodyType);
  } else {
    func->body = make(bodyType);
  }

  // Add hang limit checks after all other operations on the function body.
  wasm.addFunction(std::move(allocation));
  // Export some functions, but not all (to allow inlining etc.). Try to export
  // at least one, though, to keep each testcase interesting. Avoid non-
  // nullable params, as those cannot be constructed by the fuzzer on the
  // outside.
  bool validExportParams =
    std::all_of(paramType.begin(), paramType.end(), [&](Type t) {
      return t.isDefaultable();
    });
  if (validExportParams && (numAddedFunctions == 0 || oneIn(2)) &&
      !wasm.getExportOrNull(func->name) && !preserveImportsAndExports) {
    wasm.addExport(new Export(func->name, ExternalKind::Function, func->name));
  }
  // add some to an elem segment
  while (oneIn(3) && !random.finished()) {
    auto type = Type(func->type, NonNullable);
    std::vector<ElementSegment*> compatibleSegments;
    ModuleUtils::iterActiveElementSegments(wasm, [&](ElementSegment* segment) {
      if (Type::isSubType(type, segment->type)) {
        compatibleSegments.push_back(segment);
      }
    });
    auto& randomElem = compatibleSegments[upTo(compatibleSegments.size())];
    randomElem->data.push_back(builder.makeRefFunc(func->name, func->type));
  }
  numAddedFunctions++;
  return func;
}